

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

bool tinyusdz::inverse(matrix4d *_m,matrix4d *inv_m,double eps)

{
  bool bVar1;
  matrix4d local_b0;
  double local_30;
  double det;
  double eps_local;
  matrix4d *inv_m_local;
  matrix4d *_m_local;
  
  det = eps;
  eps_local = (double)inv_m;
  inv_m_local = _m;
  local_30 = determinant(_m);
  bVar1 = math::is_close(ABS(local_30),0.0,det);
  if (!bVar1) {
    inverse(&local_b0,inv_m_local);
    memcpy((void *)eps_local,&local_b0,0x80);
  }
  _m_local._7_1_ = !bVar1;
  return _m_local._7_1_;
}

Assistant:

bool inverse(const value::matrix4d &_m, value::matrix4d &inv_m, double eps) {
  double det = determinant(_m);

  if (math::is_close(std::fabs(det), 0.0, eps)) {
    return false;
  }

  inv_m = inverse(_m);
  return true;
}